

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::test_case_end
          (ConsoleReporter *this,CurrentTestCaseStats *st)

{
  _Setprecision _Var1;
  ostream *poVar2;
  void *pvVar3;
  long in_RSI;
  long in_RDI;
  ConsoleReporter *unaff_retaddr;
  Enum in_stack_ffffffffffffffcc;
  ostream *in_stack_ffffffffffffffd0;
  
  if ((*(byte *)(*(long *)(in_RDI + 0x68) + 0x3a) & 1) == 0) {
    if (((*(byte *)(*(long *)(in_RDI + 0x60) + 0x6f) & 1) != 0) ||
       ((*(int *)(in_RSI + 0x10) != 0 && (*(int *)(in_RSI + 0x10) != 1)))) {
      logTestStart(unaff_retaddr);
    }
    if ((*(byte *)(*(long *)(in_RDI + 0x60) + 0x6f) & 1) != 0) {
      poVar2 = Color::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      _Var1 = std::setprecision(6);
      poVar2 = std::operator<<(poVar2,_Var1);
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::fixed);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,*(double *)(in_RSI + 8));
      poVar2 = std::operator<<(poVar2," s: ");
      poVar2 = std::operator<<(poVar2,*(char **)(*(long *)(in_RDI + 0x68) + 0x20));
      std::operator<<(poVar2,"\n");
    }
    if ((*(uint *)(in_RSI + 0x10) & 0x10) != 0) {
      poVar2 = Color::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      in_stack_ffffffffffffffd0 = std::operator<<(poVar2,"Test case exceeded time limit of ");
      _Var1 = std::setprecision(6);
      poVar2 = std::operator<<(in_stack_ffffffffffffffd0,_Var1);
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::fixed);
      poVar2 = (ostream *)
               std::ostream::operator<<(pvVar3,*(double *)(*(long *)(in_RDI + 0x68) + 0x48));
      std::operator<<(poVar2,"!\n");
    }
    if ((*(uint *)(in_RSI + 0x10) & 0x20) == 0) {
      if ((*(uint *)(in_RSI + 0x10) & 0x40) == 0) {
        if ((*(uint *)(in_RSI + 0x10) & 0x200) == 0) {
          if ((*(uint *)(in_RSI + 0x10) & 0x80) == 0) {
            if ((*(uint *)(in_RSI + 0x10) & 0x100) != 0) {
              poVar2 = Color::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
              poVar2 = std::operator<<(poVar2,"Failed exactly ");
              poVar2 = (ostream *)
                       std::ostream::operator<<(poVar2,*(int *)(*(long *)(in_RDI + 0x68) + 0x40));
              std::operator<<(poVar2," times as expected so marking it as not failed!\n");
            }
          }
          else {
            poVar2 = Color::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
            poVar2 = std::operator<<(poVar2,"Didn\'t fail exactly ");
            poVar2 = (ostream *)
                     std::ostream::operator<<(poVar2,*(int *)(*(long *)(in_RDI + 0x68) + 0x40));
            std::operator<<(poVar2," times so marking it as failed!\n");
          }
        }
        else {
          poVar2 = Color::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
          std::operator<<(poVar2,"Allowed to fail so marking it as not failed\n");
        }
      }
      else {
        poVar2 = Color::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        std::operator<<(poVar2,"Failed as expected so marking it as not failed\n");
      }
    }
    else {
      poVar2 = Color::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      std::operator<<(poVar2,"Should have failed but didn\'t! Marking it as failed!\n");
    }
    if ((*(uint *)(in_RSI + 0x10) & 8) != 0) {
      poVar2 = Color::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      std::operator<<(poVar2,"Aborting - too many failed asserts!\n");
    }
    Color::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats& st) override {
            if(tc->m_no_output)
                return;

            // log the preamble of the test case only if there is something
            // else to print - something other than that an assert has failed
            if(opt.duration ||
               (st.failure_flags && st.failure_flags != TestCaseFailureReason::AssertFailure))
                logTestStart();

            if(opt.duration)
                s << Color::None << std::setprecision(6) << std::fixed << st.seconds
                  << " s: " << tc->m_name << "\n";

            if(st.failure_flags & TestCaseFailureReason::Timeout)
                s << Color::Red << "Test case exceeded time limit of " << std::setprecision(6)
                  << std::fixed << tc->m_timeout << "!\n";

            if(st.failure_flags & TestCaseFailureReason::ShouldHaveFailedButDidnt) {
                s << Color::Red << "Should have failed but didn't! Marking it as failed!\n";
            } else if(st.failure_flags & TestCaseFailureReason::ShouldHaveFailedAndDid) {
                s << Color::Yellow << "Failed as expected so marking it as not failed\n";
            } else if(st.failure_flags & TestCaseFailureReason::CouldHaveFailedAndDid) {
                s << Color::Yellow << "Allowed to fail so marking it as not failed\n";
            } else if(st.failure_flags & TestCaseFailureReason::DidntFailExactlyNumTimes) {
                s << Color::Red << "Didn't fail exactly " << tc->m_expected_failures
                  << " times so marking it as failed!\n";
            } else if(st.failure_flags & TestCaseFailureReason::FailedExactlyNumTimes) {
                s << Color::Yellow << "Failed exactly " << tc->m_expected_failures
                  << " times as expected so marking it as not failed!\n";
            }
            if(st.failure_flags & TestCaseFailureReason::TooManyFailedAsserts) {
                s << Color::Red << "Aborting - too many failed asserts!\n";
            }
            s << Color::None; // lgtm [cpp/useless-expression]
        }